

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int LTintfloat(lua_Integer i,lua_Number f)

{
  lua_Number f_local;
  lua_Integer i_local;
  
  if ((i < -0x20000000000000) || (0x20000000000000 < i)) {
    if (f < 9.223372036854776e+18) {
      if (f <= -9.223372036854776e+18) {
        i_local._4_4_ = 0;
      }
      else {
        i_local._4_4_ = (uint)(i < (long)f);
      }
    }
    else {
      i_local._4_4_ = 1;
    }
  }
  else {
    i_local._4_4_ = (uint)((double)i < f);
  }
  return i_local._4_4_;
}

Assistant:

static int LTintfloat (lua_Integer i, lua_Number f) {
#if defined(l_intfitsf)
  if (!l_intfitsf(i)) {
    if (f >= -cast_num(LUA_MININTEGER))  /* -minint == maxint + 1 */
      return 1;  /* f >= maxint + 1 > i */
    else if (f > cast_num(LUA_MININTEGER))  /* minint < f <= maxint ? */
      return (i < cast(lua_Integer, f));  /* compare them as integers */
    else  /* f <= minint <= i (or 'f' is NaN)  -->  not(i < f) */
      return 0;
  }
#endif
  return luai_numlt(cast_num(i), f);  /* compare them as floats */
}